

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int register_leap_second(double leap_second)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  double tmp;
  double *new_leap_second_table;
  double dStack_18;
  int i;
  double leap_second_local;
  
  lVar3 = __tls_get_addr(&PTR_00246d10);
  if (*(int *)(lVar3 + 0x1130) % 0x10 == 0) {
    lVar3 = __tls_get_addr(&PTR_00246d10);
    pvVar4 = *(void **)(lVar3 + 0x1128);
    lVar3 = __tls_get_addr(&PTR_00246d10);
    pvVar4 = realloc(pvVar4,(long)(*(int *)(lVar3 + 0x1130) + 0x10) << 3);
    if (pvVar4 == (void *)0x0) {
      lVar3 = __tls_get_addr(&PTR_00246d10);
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     (long)(*(int *)(lVar3 + 0x1130) + 0x10) << 3,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                     ,0x261);
      return -1;
    }
    lVar3 = __tls_get_addr(&PTR_00246d10);
    *(void **)(lVar3 + 0x1128) = pvVar4;
  }
  lVar3 = __tls_get_addr(&PTR_00246d10);
  dStack_18 = leap_second;
  if (0 < *(int *)(lVar3 + 0x1130)) {
    lVar3 = __tls_get_addr(&PTR_00246d10);
    lVar3 = *(long *)(lVar3 + 0x1128);
    lVar5 = __tls_get_addr(&PTR_00246d10);
    if (leap_second <= *(double *)(lVar3 + (long)(*(int *)(lVar5 + 0x1130) + -1) * 8)) {
      for (new_leap_second_table._4_4_ = 0; lVar3 = __tls_get_addr(&PTR_00246d10),
          new_leap_second_table._4_4_ < *(int *)(lVar3 + 0x1130);
          new_leap_second_table._4_4_ = new_leap_second_table._4_4_ + 1) {
        lVar3 = __tls_get_addr(&PTR_00246d10);
        if (dStack_18 <=
            *(double *)(*(long *)(lVar3 + 0x1128) + (long)new_leap_second_table._4_4_ * 8)) {
          lVar3 = __tls_get_addr(&PTR_00246d10);
          pdVar1 = (double *)(*(long *)(lVar3 + 0x1128) + (long)new_leap_second_table._4_4_ * 8);
          if ((dStack_18 == *pdVar1) && (!NAN(dStack_18) && !NAN(*pdVar1))) {
            return 0;
          }
          lVar3 = __tls_get_addr(&PTR_00246d10);
          dVar2 = *(double *)(*(long *)(lVar3 + 0x1128) + (long)new_leap_second_table._4_4_ * 8);
          lVar3 = __tls_get_addr(&PTR_00246d10);
          *(double *)(*(long *)(lVar3 + 0x1128) + (long)new_leap_second_table._4_4_ * 8) = dStack_18
          ;
          dStack_18 = dVar2;
        }
      }
    }
  }
  lVar3 = __tls_get_addr(&PTR_00246d10);
  lVar3 = *(long *)(lVar3 + 0x1128);
  lVar5 = __tls_get_addr(&PTR_00246d10);
  *(double *)(lVar3 + (long)*(int *)(lVar5 + 0x1130) * 8) = dStack_18;
  lVar3 = __tls_get_addr(&PTR_00246d10);
  *(int *)(lVar3 + 0x1130) = *(int *)(lVar3 + 0x1130) + 1;
  return 0;
}

Assistant:

static int register_leap_second(double leap_second)
{
    int i;

    if (num_leap_seconds % BLOCK_SIZE == 0)
    {
        double *new_leap_second_table;

        new_leap_second_table = realloc(leap_second_table, (num_leap_seconds + BLOCK_SIZE) * sizeof(double));
        if (new_leap_second_table == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (num_leap_seconds + BLOCK_SIZE) * sizeof(double), __FILE__, __LINE__);
            return -1;
        }
        leap_second_table = new_leap_second_table;
    }
    if (num_leap_seconds > 0 && leap_second <= leap_second_table[num_leap_seconds - 1])
    {
        /* do sorted insert */
        for (i = 0; i < num_leap_seconds; i++)
        {
            if (leap_second <= leap_second_table[i])
            {
                double tmp;

                if (leap_second == leap_second_table[i])
                {
                    /* ignore double leap_second entries */
                    return 0;
                }
                tmp = leap_second_table[i];
                leap_second_table[i] = leap_second;
                leap_second = tmp;
            }
        }
    }
    leap_second_table[num_leap_seconds] = leap_second;
    num_leap_seconds++;

    return 0;
}